

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<short,unsigned_int>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<short,unsigned_int>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_int>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_int>::b1 = LessThanTest<short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_int>()::b1);
    }
  }
  if (ComparisonTestTU<short,unsigned_int>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_int>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_int>::b2 = LessThanEqualTest<short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_int>()::b2);
    }
  }
  if (ComparisonTestTU<short,unsigned_int>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_int>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_int>::b3 = GreaterThanTest<short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_int>()::b3);
    }
  }
  if (ComparisonTestTU<short,unsigned_int>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_int>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_int>::b4 = GreaterThanEqualTest<short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_int>()::b4);
    }
  }
  if (ComparisonTestTU<short,unsigned_int>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_int>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_int>::b5 = EqualTest<short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_int>()::b5);
    }
  }
  if (ComparisonTestTU<short,unsigned_int>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<short,unsigned_int>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<short,_unsigned_int>::b6 = NotEqualTest<short,unsigned_int>();
      __cxa_guard_release(&ComparisonTestTU<short,unsigned_int>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}